

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mem.cpp
# Opt level: O1

void * crnlib::crnlib_default_realloc
                 (void *p,size_t size,size_t *pActual_size,bool movable,void *param_5)

{
  void *pvVar1;
  size_t sVar2;
  void *pvVar3;
  
  if (p == (void *)0x0) {
    pvVar3 = malloc(size);
    if (pvVar3 == (void *)0x0) {
      printf("WARNING: ::malloc() of size %u failed!\n",size & 0xffffffff);
    }
    if (pActual_size == (size_t *)0x0) {
      return pvVar3;
    }
    pvVar1 = pvVar3;
    if (pvVar3 == (void *)0x0) {
      sVar2 = 0;
      goto LAB_0012c9d5;
    }
  }
  else {
    if (size == 0) {
      free(p);
      sVar2 = 0;
      pvVar3 = (void *)0x0;
      if (pActual_size == (size_t *)0x0) {
        return (void *)0x0;
      }
      goto LAB_0012c9d5;
    }
    if (movable) {
      pvVar1 = realloc(p,size);
      pvVar3 = pvVar1;
      if (pvVar1 == (void *)0x0) {
        printf("WARNING: ::realloc() of size %u failed!\n",size & 0xffffffff);
        goto LAB_0012c9bc;
      }
    }
    else {
LAB_0012c9bc:
      pvVar1 = (void *)0x0;
      pvVar3 = p;
    }
    if (pActual_size == (size_t *)0x0) {
      return pvVar1;
    }
  }
  sVar2 = malloc_usable_size(pvVar3);
  pvVar3 = pvVar1;
LAB_0012c9d5:
  *pActual_size = sVar2;
  return pvVar3;
}

Assistant:

static void* crnlib_default_realloc(void* p, size_t size, size_t* pActual_size, bool movable, void*)
    {
        void* p_new;

        if (!p)
        {
            p_new = ::malloc(size);
            CRNLIB_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) == 0);

            if (!p_new)
            {
                printf("WARNING: ::malloc() of size %u failed!\n", (uint)size);
            }

            if (pActual_size)
            {
                *pActual_size = p_new ? ::_msize(p_new) : 0;
            }
        }
        else if (!size)
        {
            ::free(p);
            p_new = nullptr;

            if (pActual_size)
            {
                *pActual_size = 0;
            }
        }
        else
        {
            void* p_final_block = p;
#ifdef WIN32
            p_new = ::_expand(p, size);
#else
            p_new = nullptr;
#endif

            if (p_new)
            {
                CRNLIB_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) == 0);
                p_final_block = p_new;
            }
            else if (movable)
            {
                p_new = ::realloc(p, size);

                if (p_new)
                {
                    CRNLIB_ASSERT((reinterpret_cast<ptr_bits_t>(p_new) & (CRNLIB_MIN_ALLOC_ALIGNMENT - 1)) == 0);
                    p_final_block = p_new;
                }
                else
                {
                    printf("WARNING: ::realloc() of size %u failed!\n", (uint)size);
                }
            }

            if (pActual_size)
            {
                *pActual_size = ::_msize(p_final_block);
            }
        }

        return p_new;
    }